

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O0

void __thiscall
t_netstd_generator::generate_serialize_list_element
          (t_netstd_generator *this,ostream *out,t_list *tlist,string *iter)

{
  t_type *type;
  allocator local_129;
  string local_128;
  string local_f8;
  undefined1 local_d8 [8];
  t_field efield;
  string *iter_local;
  t_list *tlist_local;
  ostream *out_local;
  t_netstd_generator *this_local;
  
  efield._168_8_ = iter;
  type = t_list::get_elem_type(tlist);
  std::__cxx11::string::string((string *)&local_f8,(string *)iter);
  t_field::t_field((t_field *)local_d8,type,&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_128,"",&local_129);
  generate_serialize_field(this,out,(t_field *)local_d8,&local_128,false);
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  t_field::~t_field((t_field *)local_d8);
  return;
}

Assistant:

void t_netstd_generator::generate_serialize_list_element(ostream& out, t_list* tlist, string iter)
{
    t_field efield(tlist->get_elem_type(), iter);
    generate_serialize_field(out, &efield, "");
}